

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

int traverseephemeron(global_State *g,Table *h)

{
  byte bVar1;
  uint uVar2;
  Node *pNVar3;
  GCObject *pGVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  Node *n;
  int local_3c;
  
  pNVar3 = h->node;
  bVar1 = h->lsizenode;
  lVar9 = 8;
  local_3c = 0;
  for (uVar8 = 0; uVar8 < h->sizearray; uVar8 = uVar8 + 1) {
    if (((*(byte *)((long)&h->array->value_ + lVar9) & 0x40) != 0) &&
       (pGVar4 = *(GCObject **)((long)h->array + lVar9 + -8), (pGVar4->marked & 3) != 0)) {
      reallymarkobject(g,pGVar4);
      local_3c = 1;
    }
    lVar9 = lVar9 + 0x10;
  }
  bVar6 = false;
  bVar5 = false;
  for (n = h->node; n < pNVar3 + (1 << (bVar1 & 0x1f)); n = n + 1) {
    if ((n->i_val).tt_ == 0) {
      removeentry(n);
    }
    else {
      iVar7 = iscleared(g,&(n->i_key).tvk);
      uVar2 = (n->i_val).tt_;
      if (iVar7 == 0) {
        if (((uVar2 & 0x40) != 0) && (pGVar4 = (n->i_val).value_.gc, (pGVar4->marked & 3) != 0)) {
          reallymarkobject(g,pGVar4);
          local_3c = 1;
        }
      }
      else if ((uVar2 & 0x40) == 0) {
        bVar6 = true;
      }
      else {
        bVar6 = true;
        if ((((n->i_val).value_.gc)->marked & 3) != 0) {
          bVar5 = true;
        }
      }
    }
  }
  if (g->gcstate == '\0') {
    lVar9 = 0x78;
  }
  else {
    lVar9 = 0x88;
    if ((!bVar5) && (lVar9 = 0x90, !bVar6)) {
      return local_3c;
    }
  }
  h->gclist = *(GCObject **)((long)&g->frealloc + lVar9);
  *(Table **)((long)&g->frealloc + lVar9) = h;
  return local_3c;
}

Assistant:

static int traverseephemeron(global_State *g, Table *h) {
    int marked = 0;  /* true if an object is marked in this traversal */
    int hasclears = 0;  /* true if table has white keys */
    int hasww = 0;  /* true if table has entry "white-key -> white-value" */
    Node *n, *limit = gnodelast(h);
    unsigned int i;
    /* traverse array part */
    for (i = 0; i < h->sizearray; i++) {
        if (valiswhite(&h->array[i])) {
            marked = 1;
            reallymarkobject(g, gcvalue(&h->array[i]));
        }
    }
    /* traverse hash part */
    for (n = gnode(h, 0); n < limit; n++) {
        checkdeadkey(n);
        if (ttisnil(gval(n)))  /* entry is empty? */
            removeentry(n);  /* remove it */
        else if (iscleared(g, gkey(n))) {  /* key is not marked (yet)? */
            hasclears = 1;  /* table must be cleared */
            if (valiswhite(gval(n)))  /* value not marked yet? */
                hasww = 1;  /* white-white entry */
        } else if (valiswhite(gval(n))) {  /* value not marked yet? */
            marked = 1;
            reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
        }
    }
    /* link table into proper list */
    if (g->gcstate == GCSpropagate)
        linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
    else if (hasww)  /* table has white->white entries? */
        linkgclist(h, g->ephemeron);  /* have to propagate again */
    else if (hasclears)  /* table has white keys? */
        linkgclist(h, g->allweak);  /* may have to clean white keys */
    return marked;
}